

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O0

void round_shift_rect_array_32_avx2(__m256i *input,__m256i *output,int size,int bit,int val)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i vec;
  __m256i vec_00;
  __m256i vec_01;
  undefined1 auVar3 [32];
  undefined8 *puVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  __m256i r1_1;
  __m256i r0_1;
  int i_1;
  __m256i r1;
  __m256i r0;
  int i;
  __m256i sqrt2;
  undefined8 local_260;
  undefined8 uStackY_258;
  undefined8 uStackY_250;
  undefined8 uStackY_248;
  int in_stack_fffffffffffffdd4;
  longlong in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffde0 [24];
  int local_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  int local_1a4;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar9 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
  auVar9 = vpinsrd_avx(auVar9,in_R8D,2);
  auVar9 = vpinsrd_avx(auVar9,in_R8D,3);
  auVar6 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
  auVar6 = vpinsrd_avx(auVar6,in_R8D,2);
  auVar6 = vpinsrd_avx(auVar6,in_R8D,3);
  auVar6 = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar6;
  auVar9 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9;
  uStack_70 = auVar9._0_8_;
  uStack_68 = auVar9._8_8_;
  if (in_ECX < 1) {
    for (local_204 = 0; local_204 < in_EDX; local_204 = local_204 + 1) {
      auVar2 = vpslld_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_204 * 0x20),
                           ZEXT416((uint)-in_ECX));
      auVar1._16_8_ = uStack_70;
      auVar1._0_16_ = auVar6;
      auVar1._24_8_ = uStack_68;
      auVar1 = vpmulld_avx2(auVar1,auVar2);
      local_260 = auVar1._0_8_;
      uStackY_258 = auVar1._8_8_;
      uStackY_250 = auVar1._16_8_;
      uStackY_248 = auVar1._24_8_;
      vec_01[1] = in_stack_fffffffffffffde0._0_8_;
      vec_01[2] = in_stack_fffffffffffffde0._8_8_;
      vec_01[3] = in_stack_fffffffffffffde0._16_8_;
      vec_01[0] = auVar2._24_8_;
      round_shift_32_avx2(vec_01,auVar2._20_4_);
      puVar4 = (undefined8 *)(in_RSI + (long)local_204 * 0x20);
      *puVar4 = local_260;
      puVar4[1] = uStackY_258;
      puVar4[2] = uStackY_250;
      puVar4[3] = uStackY_248;
    }
  }
  else {
    for (local_1a4 = 0; local_1a4 < in_EDX; local_1a4 = local_1a4 + 1) {
      puVar4 = (undefined8 *)(in_RDI + (long)local_1a4 * 0x20);
      uVar5 = *puVar4;
      uVar7 = puVar4[1];
      uVar8 = puVar4[2];
      uVar10 = puVar4[3];
      vec[1] = in_stack_fffffffffffffde0._0_8_;
      vec[2] = in_stack_fffffffffffffde0._8_8_;
      vec[3] = in_stack_fffffffffffffde0._16_8_;
      vec[0] = in_stack_fffffffffffffdd8;
      round_shift_32_avx2(vec,in_stack_fffffffffffffdd4);
      auVar3._16_8_ = uStack_70;
      auVar3._0_16_ = auVar6;
      auVar3._24_8_ = uStack_68;
      auVar2._8_8_ = uVar7;
      auVar2._0_8_ = uVar5;
      auVar2._16_8_ = uVar8;
      auVar2._24_8_ = uVar10;
      auVar1 = vpmulld_avx2(auVar3,auVar2);
      local_200 = auVar1._0_8_;
      uStack_1f8 = auVar1._8_8_;
      uStack_1f0 = auVar1._16_8_;
      uStack_1e8 = auVar1._24_8_;
      vec_00[1] = in_stack_fffffffffffffde0._0_8_;
      vec_00[2] = in_stack_fffffffffffffde0._8_8_;
      vec_00[3] = in_stack_fffffffffffffde0._16_8_;
      vec_00[0] = in_stack_fffffffffffffdd8;
      round_shift_32_avx2(vec_00,in_stack_fffffffffffffdd4);
      puVar4 = (undefined8 *)(in_RSI + (long)local_1a4 * 0x20);
      *puVar4 = local_200;
      puVar4[1] = uStack_1f8;
      puVar4[2] = uStack_1f0;
      puVar4[3] = uStack_1e8;
    }
  }
  return;
}

Assistant:

static inline void round_shift_rect_array_32_avx2(__m256i *input,
                                                  __m256i *output,
                                                  const int size, const int bit,
                                                  const int val) {
  const __m256i sqrt2 = _mm256_set1_epi32(val);
  if (bit > 0) {
    int i;
    for (i = 0; i < size; i++) {
      const __m256i r0 = round_shift_32_avx2(input[i], bit);
      const __m256i r1 = _mm256_mullo_epi32(sqrt2, r0);
      output[i] = round_shift_32_avx2(r1, NewSqrt2Bits);
    }
  } else {
    int i;
    for (i = 0; i < size; i++) {
      const __m256i r0 = _mm256_slli_epi32(input[i], -bit);
      const __m256i r1 = _mm256_mullo_epi32(sqrt2, r0);
      output[i] = round_shift_32_avx2(r1, NewSqrt2Bits);
    }
  }
}